

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>_>
        *this)

{
  bool bVar1;
  size_t sVar2;
  iterator __end0;
  iterator __begin0;
  OUT OStack_1e8;
  iterator local_1c8;
  iterator local_140;
  iterator local_b8;
  
  begin(&local_140,this);
  end(&local_1c8,this);
  sVar2 = 0;
  while( true ) {
    iterator::iterator(&local_b8,&local_1c8);
    bVar1 = iterator::operator!=(&local_140,&local_b8);
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
    ::~GroupByState(&local_b8.source);
    if (!bVar1) break;
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
    ::Current(&OStack_1e8,&local_140.source);
    sVar2 = sVar2 + 1;
    IEnumerable<int_&>::~IEnumerable(&OStack_1e8.super_IEnumerable<int_&>);
    iterator::operator++(&local_140);
  }
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
  ::~GroupByState(&local_1c8.source);
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
  ::~GroupByState(&local_140.source);
  return sVar2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}